

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlStaticCopyNodeList(xmlNodePtr node,xmlDocPtr doc,xmlNodePtr parent)

{
  xmlDtdPtr local_40;
  xmlNodePtr q;
  xmlNodePtr p;
  xmlNodePtr ret;
  xmlNodePtr parent_local;
  xmlDocPtr doc_local;
  xmlNodePtr node_local;
  
  p = (xmlNodePtr)0x0;
  q = (xmlNodePtr)0x0;
  doc_local = (xmlDocPtr)node;
LAB_001be414:
  do {
    if (doc_local == (xmlDocPtr)0x0) {
      return p;
    }
    if (doc_local->type == XML_DTD_NODE) {
      if (doc == (xmlDocPtr)0x0) {
        doc_local = (xmlDocPtr)doc_local->next;
        goto LAB_001be414;
      }
      if (doc->intSubset == (_xmlDtd *)0x0) {
        local_40 = xmlCopyDtd((xmlDtdPtr)doc_local);
        if (local_40 == (xmlDtdPtr)0x0) goto LAB_001be53f;
        local_40->doc = doc;
        local_40->parent = (_xmlDoc *)parent;
        doc->intSubset = local_40;
        xmlAddChild(parent,(xmlNodePtr)local_40);
      }
      else {
        local_40 = doc->intSubset;
        xmlAddChild(parent,(xmlNodePtr)local_40);
      }
    }
    else {
      local_40 = (xmlDtdPtr)xmlStaticCopyNode((xmlNodePtr)doc_local,doc,parent,1);
    }
    if (local_40 == (xmlDtdPtr)0x0) {
LAB_001be53f:
      xmlFreeNodeList(p);
      return (xmlNodePtr)0x0;
    }
    if (p == (xmlNodePtr)0x0) {
      local_40->prev = (_xmlNode *)0x0;
      q = (xmlNodePtr)local_40;
      p = (xmlNodePtr)local_40;
    }
    else if ((xmlDtdPtr)q != local_40) {
      q->next = (_xmlNode *)local_40;
      local_40->prev = q;
      q = (xmlNodePtr)local_40;
    }
    doc_local = (xmlDocPtr)doc_local->next;
  } while( true );
}

Assistant:

xmlNodePtr
xmlStaticCopyNodeList(xmlNodePtr node, xmlDocPtr doc, xmlNodePtr parent) {
    xmlNodePtr ret = NULL;
    xmlNodePtr p = NULL,q;

    while (node != NULL) {
#ifdef LIBXML_TREE_ENABLED
	if (node->type == XML_DTD_NODE ) {
	    if (doc == NULL) {
		node = node->next;
		continue;
	    }
	    if (doc->intSubset == NULL) {
		q = (xmlNodePtr) xmlCopyDtd( (xmlDtdPtr) node );
		if (q == NULL) goto error;
		q->doc = doc;
		q->parent = parent;
		doc->intSubset = (xmlDtdPtr) q;
		xmlAddChild(parent, q);
	    } else {
		q = (xmlNodePtr) doc->intSubset;
		xmlAddChild(parent, q);
	    }
	} else
#endif /* LIBXML_TREE_ENABLED */
	    q = xmlStaticCopyNode(node, doc, parent, 1);
	if (q == NULL) goto error;
	if (ret == NULL) {
	    q->prev = NULL;
	    ret = p = q;
	} else if (p != q) {
	/* the test is required if xmlStaticCopyNode coalesced 2 text nodes */
	    p->next = q;
	    q->prev = p;
	    p = q;
	}
	node = node->next;
    }
    return(ret);
error:
    xmlFreeNodeList(ret);
    return(NULL);
}